

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O3

void * mwMalloc(size_t size,char *file,int line)

{
  mwData **__s;
  int iVar1;
  mwData *pmVar2;
  mwStat *pmVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  uchar *ptr;
  unsigned_long uVar7;
  mwData *pmVar8;
  ulong uVar9;
  ulong __size;
  
  pcVar6 = file;
  if (mwInited == 0) {
    mwUseAtexit = 1;
    mwInit();
  }
  iVar1 = (int)pcVar6;
  if (mwTestAlways != 0) {
    iVar1 = line;
    mwTestNow(file,line,1);
  }
  uVar7 = mwCounter + 1;
  uVar9 = 0x10;
  if (mwDataSize != '\0') {
    uVar9 = 0x48;
  }
  __size = uVar9 + size;
  if (CARRY8(uVar9,size)) {
    mwCounter = uVar7;
    return (void *)0x0;
  }
  mwCounter = uVar7;
  if ((mwUseLimit == '\x01') && (mwAllocLimit < (long)(mwStatCurAlloc + size))) {
    pcVar6 = "limit fail: <%ld> %s(%d), %ld wanted %ld available\n";
    lVar5 = mwAllocLimit - mwStatCurAlloc;
  }
  else {
    pmVar2 = (mwData *)malloc(__size);
    if (pmVar2 != (mwData *)0x0) {
LAB_00107777:
      pmVar2->count = uVar7;
      pmVar2->prev = (mwData *)0x0;
      pmVar2->next = mwHead;
      pmVar2->file = file;
      pmVar2->size = size;
      pmVar2->line = line;
      pmVar2->flag = 0;
      pmVar2->check = (long)line ^ size ^ uVar7 ^ 0xfe0180;
      if (mwHead != (mwData *)0x0) {
        mwHead->prev = pmVar2;
      }
      if (mwTail == (mwData *)0x0) {
        mwTail = pmVar2;
      }
      pmVar8 = pmVar2 + 1;
      if (mwDataSize == '\0') {
        pmVar8 = pmVar2;
      }
      mwHead = pmVar2;
      pmVar8->prev = (mwData *)0x68637441776d456d;
      __s = &pmVar8->next;
      memset(__s,0xfe,size);
      *(undefined8 *)((long)&pmVar8->next + size) = 0x68637441776d456d;
      mwNumCurAlloc = mwNumCurAlloc + 1;
      mwStatTotAlloc = mwStatTotAlloc + size;
      mwStatCurAlloc = mwStatCurAlloc + size;
      if (mwStatMaxAlloc < mwStatCurAlloc) {
        mwStatMaxAlloc = mwStatCurAlloc;
      }
      mwStatNumAlloc = mwStatNumAlloc + 1;
      if (mwStatLevel == 0) {
        return __s;
      }
      pmVar3 = mwStatGet(file,-1,1);
      if (pmVar3 != (mwStat *)0x0) {
        lVar5 = pmVar3->curr + size;
        pmVar3->curr = lVar5;
        pmVar3->total = size + pmVar3->total;
        pmVar3->num = pmVar3->num + 1;
        if (pmVar3->max < lVar5) {
          pmVar3->max = lVar5;
        }
      }
      if (file == (char *)0x0) {
        return __s;
      }
      if (line == -1) {
        return __s;
      }
      if (mwStatLevel < 2) {
        return __s;
      }
      pmVar3 = mwStatGet(file,line,1);
      if (pmVar3 == (mwStat *)0x0) {
        return __s;
      }
      lVar5 = size + pmVar3->curr;
      pmVar3->curr = lVar5;
      pmVar3->total = size + pmVar3->total;
      pmVar3->num = pmVar3->num + 1;
      if (lVar5 <= pmVar3->max) {
        return __s;
      }
      pmVar3->max = lVar5;
      return __s;
    }
    sVar4 = mwFreeUp(__size,iVar1);
    if (__size <= sVar4) {
      pmVar2 = (mwData *)malloc(__size);
      uVar7 = mwCounter;
      if (pmVar2 != (mwData *)0x0) goto LAB_00107777;
      mwWrite("internal: mwFreeUp(%u) reported success, but malloc() fails\n",__size);
      mwErrors = mwErrors + 1;
      iVar1 = mwFlushR();
      mwFlushingB2 = iVar1 + 1;
      mwFlushingB1 = mwFlushingB2;
      mwFlushing = mwFlushingB2;
      mwFlush();
      mwFlush();
    }
    pcVar6 = "fail: <%ld> %s(%d), %ld wanted %ld allocated\n";
    lVar5 = mwStatCurAlloc;
  }
  mwWrite(pcVar6,mwCounter,file,(ulong)(uint)line,size,lVar5);
  mwErrors = mwErrors + 1;
  iVar1 = mwFlushR();
  mwFlushingB2 = iVar1 + 1;
  mwFlushingB1 = mwFlushingB2;
  mwFlushing = mwFlushingB2;
  mwFlush();
  mwFlush();
  return (void *)0x0;
}

Assistant:

void *mwMalloc(size_t size, const char *file, int line)
{
	size_t needed;
	mwData *mw;
	char *ptr;
	void *p;

	mwAutoInit();

	MW_MUTEX_LOCK();

	TESTS(file, line);

	mwCounter ++;
	needed = mwDataSize + mwOverflowZoneSize * 2 + size;
	if (needed < size) {
		/* theoretical case: req size + mw overhead exceeded size_t limits */
		return NULL;
	}

	/* if this allocation would violate the limit, fail it */
	if (mwUseLimit && ((long)size + mwStatCurAlloc > mwAllocLimit)) {
		mwWrite("limit fail: <%ld> %s(%d), %ld wanted %ld available\n",
				mwCounter, file, line, (long)size, mwAllocLimit - mwStatCurAlloc);
		mwIncErr();
		FLUSH();
		MW_MUTEX_UNLOCK();
		return NULL;
	}

	mw = (mwData *) malloc(needed);
	if (mw == NULL) {
		if (mwFreeUp(needed, 0) >= needed) {
			mw = (mwData *) malloc(needed);
			if (mw == NULL) {
				mwWrite("internal: mwFreeUp(%u) reported success, but malloc() fails\n", needed);
				mwIncErr();
				FLUSH();
			}
		}
		if (mw == NULL) {
			mwWrite("fail: <%ld> %s(%d), %ld wanted %ld allocated\n",
					mwCounter, file, line, (long)size, mwStatCurAlloc);
			mwIncErr();
			FLUSH();
			MW_MUTEX_UNLOCK();
			return NULL;
		}
	}

	mw->count = mwCounter;
	mw->prev = NULL;
	mw->next = mwHead;
	mw->file = file;
	mw->size = size;
	mw->line = line;
	mw->flag = 0;
	mw->check = CHKVAL(mw);

	if (mwHead) {
		mwHead->prev = mw;
	}
	mwHead = mw;
	if (mwTail == NULL) {
		mwTail = mw;
	}

	ptr = ((char *)mw) + mwDataSize;
	mwWriteOF(ptr);   /* '*(long*)ptr = PRECHK;' */
	ptr += mwOverflowZoneSize;
	p = ptr;
	memset(ptr, MW_VAL_NEW, size);
	ptr += size;
	mwWriteOF(ptr);   /* '*(long*)ptr = POSTCHK;' */

	mwNumCurAlloc ++;
	mwStatCurAlloc += (long) size;
	mwStatTotAlloc += (long) size;
	if (mwStatCurAlloc > mwStatMaxAlloc) {
		mwStatMaxAlloc = mwStatCurAlloc;
	}
	mwStatNumAlloc ++;

	if (mwStatLevel) {
		mwStatAlloc(size, file, line);
	}

	MW_MUTEX_UNLOCK();
	return p;
}